

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_smlaxxx(DisasContext_conflict1 *s,arg_rrrr *a,int add_long,_Bool nt,_Bool mt)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i32 ret;
  TCGv_i32 pTVar1;
  TCGv_i32 rh;
  TCGv_i32 ret_00;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    if ((short)s->features < 0) goto LAB_005f4378;
  }
  else if ((s->features >> 0x22 & 1) != 0) {
LAB_005f4378:
    ret = load_reg(s,a->rn);
    pTVar1 = load_reg(s,a->rm);
    if (nt) {
      tcg_gen_sari_i32_aarch64(tcg_ctx,ret,ret,0x10);
    }
    else {
      tcg_gen_ext16s_i32_aarch64(tcg_ctx,ret,ret);
    }
    if (mt) {
      tcg_gen_sari_i32_aarch64(tcg_ctx,pTVar1,pTVar1,0x10);
    }
    else {
      tcg_gen_ext16s_i32_aarch64(tcg_ctx,pTVar1,pTVar1);
    }
    tcg_gen_mul_i32(tcg_ctx,ret,ret,pTVar1);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    if (add_long == 2) {
      pTVar1 = load_reg(s,a->ra);
      rh = load_reg(s,a->rd);
      ret_00 = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_sari_i32_aarch64(tcg_ctx,ret_00,ret,0x1f);
      tcg_gen_add2_i32_aarch64(tcg_ctx,pTVar1,rh,pTVar1,rh,ret,ret_00);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
      store_reg(s,a->ra,pTVar1);
      ret = rh;
    }
    else if (add_long == 1) {
      pTVar1 = load_reg(s,a->ra);
      gen_helper_add_setq(tcg_ctx,ret,tcg_ctx->cpu_env,ret,pTVar1);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
    }
    store_reg(s,a->rd,ret);
    return true;
  }
  return false;
}

Assistant:

static bool op_smlaxxx(DisasContext *s, arg_rrrr *a,
                       int add_long, bool nt, bool mt)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1, tl, th;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_5TE) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);
    gen_mulxy(tcg_ctx, t0, t1, nt, mt);
    tcg_temp_free_i32(tcg_ctx, t1);

    switch (add_long) {
    case 0:
        store_reg(s, a->rd, t0);
        break;
    case 1:
        t1 = load_reg(s, a->ra);
        gen_helper_add_setq(tcg_ctx, t0, tcg_ctx->cpu_env, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t1);
        store_reg(s, a->rd, t0);
        break;
    case 2:
        tl = load_reg(s, a->ra);
        th = load_reg(s, a->rd);
        /* Sign-extend the 32-bit product to 64 bits.  */
        t1 = tcg_temp_new_i32(tcg_ctx);
        tcg_gen_sari_i32(tcg_ctx, t1, t0, 31);
        tcg_gen_add2_i32(tcg_ctx, tl, th, tl, th, t0, t1);
        tcg_temp_free_i32(tcg_ctx, t0);
        tcg_temp_free_i32(tcg_ctx, t1);
        store_reg(s, a->ra, tl);
        store_reg(s, a->rd, th);
        break;
    default:
        g_assert_not_reached();
        break;
    }
    return true;
}